

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
SMBusSimulationDataGenerator::OutputBlockProcessCallPMBusQuery(SMBusSimulationDataGenerator *this)

{
  bool is_ack;
  char cVar1;
  
  OutputStart(this);
  OutputByte(this,0x86,true);
  OutputByte(this,'\x1a',true);
  OutputByte(this,'\x01',true);
  OutputByte(this,'\x03',true);
  OutputStart(this);
  OutputByte(this,0x87,true);
  OutputByte(this,'\x01',true);
  is_ack = (bool)AnalyzerSettingInterfaceBool::GetValue();
  OutputByte(this,0x98,is_ack);
  cVar1 = AnalyzerSettingInterfaceBool::GetValue();
  if (cVar1 != '\0') {
    OutputByte(this,'T',false);
  }
  OutputStop(this);
  ClockGenerator::AdvanceByTimeS(0.0005);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputBlockProcessCallPMBusQuery()
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( QUERY ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x01 ) ];         // block command byte count
    pec = SMBusCRCLookup[ pec ^ OutputByte( CLEAR_FAULTS ) ]; // 1 data byte is the command to query
    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, true ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x01 ) ];                       // block command byte count
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x98, mSettings->CalcPEC() ) ]; // the result
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}